

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void fix_diff_singleton(saucy *s,int cf)

{
  int cf_00;
  int iVar1;
  int iVar2;
  int rcfl;
  int l;
  int r;
  int cf_local;
  saucy *s_local;
  
  iVar1 = (s->right).lab[cf];
  iVar2 = (s->left).lab[cf];
  if (((s->right).clen[cf] == 0) && (iVar1 != iVar2)) {
    add_diff(s,iVar1);
    s->nundiffs = s->nundiffs + 1;
    remove_diffnon(s,iVar1);
    cf_00 = (s->right).cfront[iVar2];
    if ((s->right).clen[cf_00] == 0) {
      iVar2 = is_a_pair(s,iVar1);
      if (iVar2 != 0) {
        eat_pair(s,iVar1);
      }
    }
    else {
      add_diff(s,iVar2);
      iVar1 = in_cell_range(&s->right,(s->left).unlab[iVar1],cf_00);
      if (iVar1 != 0) {
        add_pair(s,iVar2);
      }
    }
  }
  return;
}

Assistant:

static void
fix_diff_singleton(struct saucy *s, int cf)
{
    int r = s->right.lab[cf];
    int l = s->left.lab[cf];
    int rcfl;

    if (!s->right.clen[cf] && r != l) {

        /* Make sure diff is marked */
        add_diff(s, r);

        /* It is now undiffed since it is singleton */
        ++s->nundiffs;
        remove_diffnon(s, r);

        /* Mark the other if not singleton already */
        rcfl = s->right.cfront[l];
        if (s->right.clen[rcfl]) {
            add_diff(s, l);

            /* Check for pairs */
            if (in_cell_range(&s->right, s->left.unlab[r], rcfl)) {
                add_pair(s, l);
            }
        }
        /* Otherwise we might be eating a pair */
        else if (is_a_pair(s, r)) {
            eat_pair(s, r);
        }
    }
}